

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL GetFileAttributesExW
               (LPCWSTR lpFileName,GET_FILEEX_INFO_LEVELS fInfoLevelId,LPVOID lpFileInformation)

{
  int iVar1;
  DWORD DVar2;
  size_t sVar3;
  char *lpMultiByteStr;
  FILETIME FVar4;
  long in_FS_OFFSET;
  int size;
  int length;
  char *name;
  stat stat_data;
  LPWIN32_FILE_ATTRIBUTE_DATA attr_data;
  DWORD dwLastError;
  BOOL bRet;
  CPalThread *pThread;
  LPVOID lpFileInformation_local;
  GET_FILEEX_INFO_LEVELS fInfoLevelId_local;
  LPCWSTR lpFileName_local;
  PathCharString namePS;
  
  namePS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  attr_data._4_4_ = 0;
  attr_data._0_4_ = 0;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpFileName_local);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (fInfoLevelId == GetFileExInfoStandard) {
    if (lpFileInformation == (LPVOID)0x0) {
      fprintf(_stderr,"] %s %s:%d","GetFileAttributesExW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
              ,0x74a);
      fprintf(_stderr,"lpFileInformation is NULL\n");
      attr_data._0_4_ = 0x57;
    }
    else if (lpFileName == (LPCWSTR)0x0) {
      attr_data._0_4_ = 3;
    }
    else {
      sVar3 = PAL_wcslen(lpFileName);
      iVar1 = ((int)sVar3 + 1) * MaxWCharToAcpLengthFactor;
      lpMultiByteStr =
           StackString<32UL,_char>::OpenStringBuffer
                     ((StackString<32UL,_char> *)&lpFileName_local,(long)iVar1);
      if (lpMultiByteStr == (char *)0x0) {
        attr_data._0_4_ = 8;
      }
      else {
        iVar1 = WideCharToMultiByte(0,0,lpFileName,-1,lpMultiByteStr,iVar1,(LPCSTR)0x0,(LPBOOL)0x0);
        StackString<32UL,_char>::CloseBuffer
                  ((StackString<32UL,_char> *)&lpFileName_local,(long)iVar1);
        if (iVar1 == 0) {
          DVar2 = GetLastError();
          if (DVar2 == 0x7a) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            attr_data._0_4_ = 0xce;
          }
          else {
            fprintf(_stderr,"] %s %s:%d","GetFileAttributesExW",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                    ,0x76a);
            fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
            attr_data._0_4_ = 0x54f;
          }
        }
        else {
          stat_data.__glibc_reserved[2] = (__syscall_slong_t)lpFileInformation;
          DVar2 = GetFileAttributesW(lpFileName);
          *(DWORD *)stat_data.__glibc_reserved[2] = DVar2;
          if (*(int *)stat_data.__glibc_reserved[2] != -1) {
            FILEDosToUnixPathA(lpMultiByteStr);
            iVar1 = stat64(lpMultiByteStr,(stat64 *)&name);
            if (iVar1 == 0) {
              FVar4 = FILEUnixTimeToFileTime(stat_data.st_mtim.tv_nsec,0);
              *(FILETIME *)(stat_data.__glibc_reserved[2] + 4) = FVar4;
              FVar4 = FILEUnixTimeToFileTime(stat_data.st_blocks,0);
              *(FILETIME *)(stat_data.__glibc_reserved[2] + 0xc) = FVar4;
              FVar4 = FILEUnixTimeToFileTime(stat_data.st_atim.tv_nsec,0);
              *(FILETIME *)(stat_data.__glibc_reserved[2] + 0x14) = FVar4;
              *(int *)(stat_data.__glibc_reserved[2] + 0x20) = (int)stat_data.st_rdev;
              *(int *)(stat_data.__glibc_reserved[2] + 0x1c) = (int)(stat_data.st_rdev >> 0x20);
              attr_data._4_4_ = 1;
            }
            else {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              attr_data._0_4_ = FILEGetLastErrorFromErrnoAndFilename(lpMultiByteStr);
            }
          }
        }
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","GetFileAttributesExW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x743);
    fprintf(_stderr,"Unrecognized value for fInfoLevelId=%d\n",(ulong)fInfoLevelId);
    attr_data._0_4_ = 0x57;
  }
  if ((PAL_ERROR)attr_data != 0) {
    CorUnix::CPalThread::SetLastError((PAL_ERROR)attr_data);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpFileName_local);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != namePS.m_count) {
      __stack_chk_fail();
    }
    return attr_data._4_4_;
  }
  abort();
}

Assistant:

BOOL
PALAPI
GetFileAttributesExW(
             IN LPCWSTR lpFileName,
             IN GET_FILEEX_INFO_LEVELS fInfoLevelId,
             OUT LPVOID lpFileInformation)
{
    CPalThread *pThread;
    BOOL bRet = FALSE;
    DWORD dwLastError = 0;
    LPWIN32_FILE_ATTRIBUTE_DATA attr_data;

    struct stat stat_data;

    char * name;
    PathCharString namePS;
    int length = 0;
    int  size;

    PERF_ENTRY(GetFileAttributesExW);
    ENTRY("GetFileAttributesExW(lpFileName=%p (%S), fInfoLevelId=%d, "
          "lpFileInformation=%p)\n", lpFileName?lpFileName:W16_NULLSTRING, lpFileName?lpFileName:W16_NULLSTRING,
          fInfoLevelId, lpFileInformation);

    pThread = InternalGetCurrentThread();
    if ( fInfoLevelId != GetFileExInfoStandard )
    {
        ASSERT("Unrecognized value for fInfoLevelId=%d\n", fInfoLevelId);
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    if ( !lpFileInformation )
    {
        ASSERT("lpFileInformation is NULL\n");
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    if (lpFileName == NULL) 
    {
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }
    
    length = (PAL_wcslen(lpFileName)+1) * MaxWCharToAcpLengthFactor;
    name = namePS.OpenStringBuffer(length);
    if (NULL == name)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    size = WideCharToMultiByte( CP_ACP, 0, lpFileName, -1, name, length,
                                NULL, NULL );
    namePS.CloseBuffer(size);
    
    if( size == 0 )
    {
        dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            dwLastError = ERROR_FILENAME_EXCED_RANGE;
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            dwLastError = ERROR_INTERNAL_ERROR;
        }
        goto done;
    }

    attr_data = (LPWIN32_FILE_ATTRIBUTE_DATA)lpFileInformation;

    attr_data->dwFileAttributes = GetFileAttributesW(lpFileName);
    /* assume that GetFileAttributes will call SetLastError appropriately */
    if ( attr_data->dwFileAttributes == (DWORD)-1 )
    {
        goto done;
    }

    FILEDosToUnixPathA(name);
    /* do the stat */
    if ( stat(name, &stat_data) != 0 )
    {
        ERROR("stat failed on %S\n", lpFileName);
        dwLastError = FILEGetLastErrorFromErrnoAndFilename(name);
        goto done;
    }

    /* get the file times */
    attr_data->ftCreationTime =
        FILEUnixTimeToFileTime( stat_data.st_ctime,
                                ST_CTIME_NSEC(&stat_data) );
    attr_data->ftLastAccessTime =
        FILEUnixTimeToFileTime( stat_data.st_atime,
                                ST_ATIME_NSEC(&stat_data) );
    attr_data->ftLastWriteTime =
        FILEUnixTimeToFileTime( stat_data.st_mtime,
                                ST_MTIME_NSEC(&stat_data) );

    /* Get the file size. GetFileSize is not used because it gets the
       size of an already-open file */
    attr_data->nFileSizeLow = (DWORD) stat_data.st_size;
#if SIZEOF_OFF_T > 4
    attr_data->nFileSizeHigh = (DWORD)(stat_data.st_size >> 32);
#else
    attr_data->nFileSizeHigh = 0;
#endif

    bRet = TRUE;

done:
    if (dwLastError) pThread->SetLastError(dwLastError);

    LOGEXIT("GetFileAttributesExW returns BOOL %d\n", bRet);
    PERF_EXIT(GetFileAttributesExW);
    return bRet;
}